

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSceneLoader14.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::SceneLoader14::begin__instance_visual_scene(SceneLoader14 *this)

{
  instance_visual_scene__AttributeData *in_stack_00000128;
  SceneLoader14 *in_stack_00000130;
  
  begin__instance_visual_scene(in_stack_00000130,in_stack_00000128);
  return;
}

Assistant:

bool SceneLoader14::begin__instance_visual_scene( const COLLADASaxFWL14::instance_visual_scene__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__instance_visual_scene(attributeData));
COLLADASaxFWL::instance_visual_scene__AttributeData attrData;
attrData.present_attributes = 0;
attrData.sid = attributeData.sid;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL14::instance_visual_scene__AttributeData::ATTRIBUTE_URL_PRESENT) == COLLADASaxFWL14::instance_visual_scene__AttributeData::ATTRIBUTE_URL_PRESENT ) {
    attrData.url = attributeData.url;
    attrData.present_attributes |= COLLADASaxFWL::instance_visual_scene__AttributeData::ATTRIBUTE_URL_PRESENT;
}
return mLoader->begin__instance_visual_scene(attrData);
}